

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

double Executor::exp(double __x)

{
  bool bVar1;
  treeNode *ptVar2;
  Var *pVVar3;
  long extraout_RAX;
  undefined8 extraout_RAX_00;
  treeNode *extraout_RAX_01;
  treeNode *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  double dVar4;
  float local_244;
  float local_23c;
  float local_22c;
  float local_224;
  float local_214;
  float local_20c;
  float local_1fc;
  float local_1f4;
  float local_1e4;
  float local_1dc;
  float local_1cc;
  float local_1c4;
  byte local_1b1;
  byte local_1a1;
  float local_194;
  float local_18c;
  float local_17c;
  float local_174;
  float local_16c;
  float local_15c;
  float local_154;
  float local_144;
  float local_13c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  treeNode *local_b0;
  treeNode *right;
  string op;
  treeNode *left;
  string local_78;
  string local_58;
  Var *local_38;
  Var *retVar;
  treeNode *local_20;
  treeNode *ret;
  treeNode *node_local;
  
  local_20 = (treeNode *)0x0;
  ret = in_RDI;
  if ((in_RDI->kind).stmtKind == ifStmt) {
    ptVar2 = (treeNode *)operator_new(0x58);
    treeNode::treeNode(ptVar2,ret);
    return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  }
  if ((in_RDI->kind).stmtKind == doRpt) {
    std::__cxx11::string::string((string *)&local_58,(string *)&in_RDI->text);
    pVVar3 = getVar(&local_58);
    __x = (double)std::__cxx11::string::~string((string *)&local_58);
    local_38 = pVVar3;
    switch(pVVar3->kind) {
    case Integer:
      ptVar2 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar2,(local_38->value).integer);
      dVar4 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      break;
    case Decmical:
      ptVar2 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar2,(local_38->value).decmical);
      dVar4 = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
      break;
    case Boolean:
      ptVar2 = (treeNode *)operator_new(0x58);
      treeNode::treeNode(ptVar2,(bool)((local_38->value).boolean & 1));
      dVar4 = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
      break;
    case Text:
      ptVar2 = (treeNode *)operator_new(0x58);
      std::__cxx11::string::string((string *)&local_78,(string *)&local_38->text);
      treeNode::treeNode(ptVar2,&local_78);
      node_local = ptVar2;
      dVar4 = (double)std::__cxx11::string::~string((string *)&local_78);
      break;
    default:
      goto switchD_00115a2c_default;
    }
  }
  else {
switchD_00115a2c_default:
    if ((ret->child[0]->kind).stmtKind == Unknown) {
      dVar4 = exp(__x);
      *(byte *)(extraout_RAX + 0x54) = (*(byte *)(extraout_RAX + 0x54) ^ 0xff) & 1;
    }
    else {
      exp(__x);
      op.field_2._8_8_ = extraout_RAX_00;
      dVar4 = (double)std::__cxx11::string::string((string *)&right,(string *)&ret->child[1]->text);
      exp(dVar4);
      local_b0 = extraout_RAX_01;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &right,"+");
      if (bVar1) {
        if ((*(int *)(op.field_2._8_8_ + 0x50) == 3) && (local_b0->attrKind == Text)) {
          ptVar2 = (treeNode *)operator_new(0x58);
          std::operator+(&local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (op.field_2._8_8_ + 0x30),&local_b0->text);
          treeNode::treeNode(ptVar2,&local_d0);
          local_20 = ptVar2;
          std::__cxx11::string::~string((string *)&local_d0);
        }
        else {
          bVar1 = checkDigit((treeNode *)op.field_2._8_8_);
          if ((bVar1) && (bVar1 = checkDigit(local_b0), bVar1)) {
            ptVar2 = (treeNode *)operator_new(0x58);
            if (*(int *)(op.field_2._8_8_ + 0x50) == 0) {
              local_13c = (float)*(int *)(op.field_2._8_8_ + 0x54);
            }
            else {
              local_13c = *(float *)(op.field_2._8_8_ + 0x54);
            }
            if (local_b0->attrKind == Integer) {
              local_144 = (float)(local_b0->attr).integer;
            }
            else {
              local_144 = (local_b0->attr).decmical;
            }
            treeNode::treeNode(ptVar2,local_13c + local_144);
            local_20 = ptVar2;
          }
          else {
            reportError(errorType);
          }
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&right,"-");
        if (bVar1) {
          ptVar2 = (treeNode *)operator_new(0x58);
          if (*(int *)(op.field_2._8_8_ + 0x50) == 0) {
            local_154 = (float)*(int *)(op.field_2._8_8_ + 0x54);
          }
          else {
            local_154 = *(float *)(op.field_2._8_8_ + 0x54);
          }
          if (local_b0->attrKind == Integer) {
            local_15c = (float)(local_b0->attr).integer;
          }
          else {
            local_15c = (local_b0->attr).decmical;
          }
          treeNode::treeNode(ptVar2,local_154 - local_15c);
          local_20 = ptVar2;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&right,"*");
          if (bVar1) {
            ptVar2 = (treeNode *)operator_new(0x58);
            if (*(int *)(op.field_2._8_8_ + 0x50) == 0) {
              local_16c = (float)*(int *)(op.field_2._8_8_ + 0x54);
            }
            else {
              local_16c = *(float *)(op.field_2._8_8_ + 0x54);
            }
            if (local_b0->attrKind == Integer) {
              local_174 = (float)(local_b0->attr).integer;
            }
            else {
              local_174 = (local_b0->attr).decmical;
            }
            treeNode::treeNode(ptVar2,local_16c * local_174);
            local_20 = ptVar2;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&right,"/");
            if (bVar1) {
              if (local_b0->attrKind == Integer) {
                local_17c = (float)(local_b0->attr).integer;
              }
              else {
                local_17c = (local_b0->attr).decmical;
              }
              if ((local_17c != 0.0) || (NAN(local_17c))) {
                ptVar2 = (treeNode *)operator_new(0x58);
                if (*(int *)(op.field_2._8_8_ + 0x50) == 0) {
                  local_18c = (float)*(int *)(op.field_2._8_8_ + 0x54);
                }
                else {
                  local_18c = *(float *)(op.field_2._8_8_ + 0x54);
                }
                if (local_b0->attrKind == Integer) {
                  local_194 = (float)(local_b0->attr).integer;
                }
                else {
                  local_194 = (local_b0->attr).decmical;
                }
                treeNode::treeNode(ptVar2,local_18c / local_194);
                local_20 = ptVar2;
              }
              else {
                reportError(divZero);
              }
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&right,"&&");
              if ((bVar1) ||
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&right,"||"), bVar1)) {
                if ((local_b0->attrKind == Boolean) || (*(int *)(op.field_2._8_8_ + 0x50) == 2)) {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&right,"&&");
                  if (bVar1) {
                    ptVar2 = (treeNode *)operator_new(0x58);
                    local_1a1 = 0;
                    if ((*(byte *)(op.field_2._8_8_ + 0x54) & 1) != 0) {
                      local_1a1 = (local_b0->attr).boolean;
                    }
                    treeNode::treeNode(ptVar2,(bool)(local_1a1 & 1));
                    local_20 = ptVar2;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&right,"||");
                    if (bVar1) {
                      ptVar2 = (treeNode *)operator_new(0x58);
                      local_1b1 = 1;
                      if ((*(byte *)(op.field_2._8_8_ + 0x54) & 1) == 0) {
                        local_1b1 = (local_b0->attr).boolean;
                      }
                      treeNode::treeNode(ptVar2,(bool)(local_1b1 & 1));
                      local_20 = ptVar2;
                    }
                  }
                }
                else {
                  reportError(errorType);
                }
              }
              else {
                bVar1 = checkDigit((treeNode *)op.field_2._8_8_);
                if ((bVar1) && (bVar1 = checkDigit(local_b0), bVar1)) {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&right,">");
                  if (bVar1) {
                    ptVar2 = (treeNode *)operator_new(0x58);
                    if (*(int *)(op.field_2._8_8_ + 0x50) == 0) {
                      local_1c4 = (float)*(int *)(op.field_2._8_8_ + 0x54);
                    }
                    else {
                      local_1c4 = *(float *)(op.field_2._8_8_ + 0x54);
                    }
                    if (local_b0->attrKind == Integer) {
                      local_1cc = (float)(local_b0->attr).integer;
                    }
                    else {
                      local_1cc = (local_b0->attr).decmical;
                    }
                    treeNode::treeNode(ptVar2,local_1cc < local_1c4);
                    local_20 = ptVar2;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&right,"<");
                    if (bVar1) {
                      ptVar2 = (treeNode *)operator_new(0x58);
                      if (*(int *)(op.field_2._8_8_ + 0x50) == 0) {
                        local_1dc = (float)*(int *)(op.field_2._8_8_ + 0x54);
                      }
                      else {
                        local_1dc = *(float *)(op.field_2._8_8_ + 0x54);
                      }
                      if (local_b0->attrKind == Integer) {
                        local_1e4 = (float)(local_b0->attr).integer;
                      }
                      else {
                        local_1e4 = (local_b0->attr).decmical;
                      }
                      treeNode::treeNode(ptVar2,local_1dc < local_1e4);
                      local_20 = ptVar2;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&right,"==");
                      if (bVar1) {
                        ptVar2 = (treeNode *)operator_new(0x58);
                        if (*(int *)(op.field_2._8_8_ + 0x50) == 0) {
                          local_1f4 = (float)*(int *)(op.field_2._8_8_ + 0x54);
                        }
                        else {
                          local_1f4 = *(float *)(op.field_2._8_8_ + 0x54);
                        }
                        if (local_b0->attrKind == Integer) {
                          local_1fc = (float)(local_b0->attr).integer;
                        }
                        else {
                          local_1fc = (local_b0->attr).decmical;
                        }
                        treeNode::treeNode(ptVar2,(bool)(-(local_1f4 == local_1fc) & 1));
                        local_20 = ptVar2;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&right,"!=");
                        if (bVar1) {
                          ptVar2 = (treeNode *)operator_new(0x58);
                          if (*(int *)(op.field_2._8_8_ + 0x50) == 0) {
                            local_20c = (float)*(int *)(op.field_2._8_8_ + 0x54);
                          }
                          else {
                            local_20c = *(float *)(op.field_2._8_8_ + 0x54);
                          }
                          if (local_b0->attrKind == Integer) {
                            local_214 = (float)(local_b0->attr).integer;
                          }
                          else {
                            local_214 = (local_b0->attr).decmical;
                          }
                          treeNode::treeNode(ptVar2,(bool)(-(local_20c != local_214) & 1));
                          local_20 = ptVar2;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&right,"<=");
                          if ((bVar1) ||
                             (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&right,"=<"), bVar1)) {
                            ptVar2 = (treeNode *)operator_new(0x58);
                            if (*(int *)(op.field_2._8_8_ + 0x50) == 0) {
                              local_224 = (float)*(int *)(op.field_2._8_8_ + 0x54);
                            }
                            else {
                              local_224 = *(float *)(op.field_2._8_8_ + 0x54);
                            }
                            if (local_b0->attrKind == Integer) {
                              local_22c = (float)(local_b0->attr).integer;
                            }
                            else {
                              local_22c = (local_b0->attr).decmical;
                            }
                            treeNode::treeNode(ptVar2,local_224 <= local_22c);
                            local_20 = ptVar2;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&right,">=");
                            if ((bVar1) ||
                               (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&right,"=>"), bVar1)) {
                              ptVar2 = (treeNode *)operator_new(0x58);
                              if (*(int *)(op.field_2._8_8_ + 0x50) == 0) {
                                local_23c = (float)*(int *)(op.field_2._8_8_ + 0x54);
                              }
                              else {
                                local_23c = *(float *)(op.field_2._8_8_ + 0x54);
                              }
                              if (local_b0->attrKind == Integer) {
                                local_244 = (float)(local_b0->attr).integer;
                              }
                              else {
                                local_244 = (local_b0->attr).decmical;
                              }
                              treeNode::treeNode(ptVar2,local_244 <= local_23c);
                              local_20 = ptVar2;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  reportError(errorType);
                }
              }
            }
          }
        }
      }
      if (op.field_2._8_8_ != 0) {
        treeNode::~treeNode((treeNode *)op.field_2._8_8_);
        operator_delete((void *)op.field_2._8_8_);
      }
      if (local_b0 != (treeNode *)0x0) {
        treeNode::~treeNode(local_b0);
        operator_delete(local_b0);
      }
      node_local = local_20;
      dVar4 = (double)std::__cxx11::string::~string((string *)&right);
    }
  }
  return dVar4;
}

Assistant:

treeNode* exp(treeNode* node)
    {
        treeNode* ret = nullptr;
        if(node->kind.expKind==ExpKind::constExp)return new treeNode(*node);
        if(node->kind.expKind==ExpKind::idExp)
        {
            auto retVar = getVar(node->text);
            switch(retVar->kind)
            {
                case AttrKind::Text:return new treeNode(retVar->text);
                case AttrKind::Integer:return new treeNode(retVar->value.integer);
                case AttrKind::Decmical:return new treeNode(retVar->value.decmical);
                case AttrKind::Boolean:return new treeNode(retVar->value.boolean);
            }
        }
        if(node->child[0]->kind.expKind==ExpKind::opExp)
        {
            ret = exp(node->child[1]);
            ret->attr.boolean=!ret->attr.boolean;
            return ret;
        }
        else 
        {
            auto left = exp(node->child[0]);
            string op = node->child[1]->text;
            auto right = exp(node->child[2]);
            if(op=="+")
            {
                if(left->attrKind==AttrKind::Text&&right->attrKind==AttrKind::Text)
                    ret = new treeNode(left->text + right->text);
                else if(checkDigit(left)&&checkDigit(right))
                    ret = new treeNode(GETDIGIT(left)+GETDIGIT(right));//string
                else
                    reportError(Error::errorType);
            } 
            else if(op=="-") ret = new treeNode(GETDIGIT(left)-GETDIGIT(right));
            else if(op=="*") ret = new treeNode(GETDIGIT(left)*GETDIGIT(right));
            else if(op=="/")
            {
                if(GETDIGIT(right)==0)
                    reportError(Error::divZero);
                else
                    ret = new treeNode(GETDIGIT(left)/GETDIGIT(right));
            }
            else if(op=="&&"||op=="||")
            {
                if(right->attrKind!=AttrKind::Boolean&&left->attrKind!=AttrKind::Boolean) 
                    reportError(Error::errorType);
                else if(op=="&&")ret = new treeNode(left->attr.boolean && right->attr.boolean);
                else if(op=="||")ret = new treeNode(left->attr.boolean || right->attr.boolean);
            }
            else
            {
                if(!(checkDigit(left)&&checkDigit(right)))reportError(Error::errorType);
                else if(op==">")ret = new treeNode(GETDIGIT(left)>GETDIGIT(right));
                else if(op=="<")ret = new treeNode(GETDIGIT(left)<GETDIGIT(right));
                else if(op=="==")ret = new treeNode(GETDIGIT(left)==GETDIGIT(right));
                else if(op=="!=")ret = new treeNode(GETDIGIT(left)!=GETDIGIT(right));
                else if(op=="<="||op=="=<")ret = new treeNode(GETDIGIT(left)<=GETDIGIT(right));
                else if(op==">="||op=="=>")ret = new treeNode(GETDIGIT(left)>=GETDIGIT(right));
            }
            delete left;
            delete right;
            return ret;
        }
    }